

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

void stbi__de_iphone(stbi__png *z)

{
  stbi_uc sVar1;
  byte bVar2;
  byte bVar3;
  stbi__context *psVar4;
  byte bVar5;
  int iVar6;
  stbi_uc *psVar7;
  long lVar8;
  
  psVar4 = z->s;
  psVar7 = z->out;
  iVar6 = psVar4->img_y * psVar4->img_x;
  if (psVar4->img_out_n == 4) {
    if (stbi__unpremultiply_on_load == 0) {
      if (iVar6 != 0) {
        lVar8 = 0;
        do {
          sVar1 = psVar7[lVar8 * 4];
          psVar7[lVar8 * 4] = psVar7[lVar8 * 4 + 2];
          psVar7[lVar8 * 4 + 2] = sVar1;
          lVar8 = lVar8 + 1;
        } while (iVar6 != (int)lVar8);
      }
    }
    else if (iVar6 != 0) {
      lVar8 = 0;
      do {
        bVar2 = psVar7[lVar8 * 4 + 3];
        bVar5 = psVar7[lVar8 * 4];
        bVar3 = psVar7[lVar8 * 4 + 2];
        if (bVar2 == 0) {
          psVar7[lVar8 * 4] = bVar3;
        }
        else {
          psVar7[lVar8 * 4] = (stbi_uc)(((uint)bVar3 * 0x100 - (uint)bVar3) / (uint)bVar2);
          psVar7[lVar8 * 4 + 1] =
               (stbi_uc)(((uint)psVar7[lVar8 * 4 + 1] * 0x100 - (uint)psVar7[lVar8 * 4 + 1]) /
                        (uint)bVar2);
          bVar5 = (byte)(((uint)bVar5 * 0x100 - (uint)bVar5) / (uint)bVar2);
        }
        psVar7[lVar8 * 4 + 2] = bVar5;
        lVar8 = lVar8 + 1;
      } while (iVar6 != (int)lVar8);
    }
  }
  else {
    if (psVar4->img_out_n != 3) {
      __assert_fail("s->img_out_n == 4",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb_image.h"
                    ,0x122a,"void stbi__de_iphone(stbi__png *)");
    }
    for (; iVar6 != 0; iVar6 = iVar6 + -1) {
      sVar1 = *psVar7;
      *psVar7 = psVar7[2];
      psVar7[2] = sVar1;
      psVar7 = psVar7 + 3;
    }
  }
  return;
}

Assistant:

static void stbi__de_iphone(stbi__png *z)
{
   stbi__context *s = z->s;
   stbi__uint32 i, pixel_count = s->img_x * s->img_y;
   stbi_uc *p = z->out;

   if (s->img_out_n == 3) {  // convert bgr to rgb
      for (i=0; i < pixel_count; ++i) {
         stbi_uc t = p[0];
         p[0] = p[2];
         p[2] = t;
         p += 3;
      }
   } else {
      STBI_ASSERT(s->img_out_n == 4);
      if (stbi__unpremultiply_on_load) {
         // convert bgr to rgb and unpremultiply
         for (i=0; i < pixel_count; ++i) {
            stbi_uc a = p[3];
            stbi_uc t = p[0];
            if (a) {
               p[0] = p[2] * 255 / a;
               p[1] = p[1] * 255 / a;
               p[2] =  t   * 255 / a;
            } else {
               p[0] = p[2];
               p[2] = t;
            }
            p += 4;
         }
      } else {
         // convert bgr to rgb
         for (i=0; i < pixel_count; ++i) {
            stbi_uc t = p[0];
            p[0] = p[2];
            p[2] = t;
            p += 4;
         }
      }
   }
}